

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O2

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int iVar21;
  void *returnvalue;
  undefined8 *returnvalue_00;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  
  lVar25 = *user_data;
  dVar2 = *(double *)((long)user_data + 0x10);
  dVar3 = *(double *)((long)user_data + 0x18);
  dVar4 = *(double *)((long)user_data + 0x58);
  dVar5 = *(double *)((long)user_data + 0x28);
  dVar6 = *(double *)((long)user_data + 0x30);
  dVar7 = *(double *)((long)user_data + 0x38);
  dVar8 = *(double *)((long)user_data + 0x40);
  dVar9 = *(double *)((long)user_data + 0x48);
  dVar10 = *(double *)((long)user_data + 0x50);
  dVar11 = *(double *)((long)user_data + 8);
  returnvalue = (void *)N_VGetArrayPointer();
  iVar21 = check_retval(returnvalue,"N_VGetArrayPointer",0);
  iVar24 = 1;
  if (iVar21 == 0) {
    returnvalue_00 = (undefined8 *)N_VGetArrayPointer(ydot);
    iVar21 = check_retval(returnvalue_00,"N_VGetArrayPointer",0);
    if (iVar21 == 0) {
      N_VConst(0,ydot);
      lVar25 = lVar25 + -1;
      lVar23 = 0x28;
      for (lVar22 = 1; lVar22 < lVar25; lVar22 = lVar22 + 1) {
        dVar12 = *(double *)((long)returnvalue + lVar23 + 8);
        pdVar1 = (double *)((long)returnvalue + lVar23 + -0x10);
        dVar19 = *pdVar1;
        dVar20 = pdVar1[1];
        dVar13 = *(double *)((long)returnvalue + lVar23 + -0x28);
        dVar14 = *(double *)((long)returnvalue + lVar23 + -0x20);
        dVar15 = *(double *)((long)returnvalue + lVar23 + 0x10);
        dVar16 = *(double *)((long)returnvalue + lVar23);
        dVar17 = *(double *)((long)returnvalue + lVar23 + -0x18);
        dVar18 = *(double *)((long)returnvalue + lVar23 + 0x18);
        pdVar1 = (double *)((long)returnvalue_00 + lVar23 + -0x10);
        *pdVar1 = dVar19 * dVar20 * dVar19 +
                  -(dVar16 + 1.0) * dVar19 +
                  (dVar12 - dVar13) * ((dVar8 * -0.5) / dVar11) +
                  ((dVar13 - (dVar19 + dVar19)) + dVar12) * ((dVar5 / dVar11) / dVar11) + dVar2;
        pdVar1[1] = -(dVar19 * dVar20) * dVar19 +
                    dVar16 * dVar19 +
                    (dVar15 - dVar14) * ((dVar9 * -0.5) / dVar11) +
                    ((dVar14 - (dVar20 + dVar20)) + dVar15) * ((dVar6 / dVar11) / dVar11);
        *(double *)((long)returnvalue_00 + lVar23) =
             ((dVar3 - dVar16) / dVar4 +
             (dVar18 - dVar17) * ((dVar10 * -0.5) / dVar11) +
             ((dVar17 - (dVar16 + dVar16)) + dVar18) * ((dVar7 / dVar11) / dVar11)) -
             dVar16 * dVar19;
        lVar23 = lVar23 + 0x18;
      }
      *returnvalue_00 = 0;
      returnvalue_00[1] = 0;
      returnvalue_00[2] = 0;
      returnvalue_00[lVar25 * 3] = 0;
      (returnvalue_00 + lVar25 * 3)[1] = 0;
      returnvalue_00[lVar25 * 3 + 2] = 0;
      iVar24 = 0;
    }
  }
  return iVar24;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype a      = udata->a;
  sunrealtype b      = udata->b;
  sunrealtype ep     = udata->ep;
  sunrealtype du     = udata->du;
  sunrealtype dv     = udata->dv;
  sunrealtype dw     = udata->dw;
  sunrealtype au     = udata->au;
  sunrealtype av     = udata->av;
  sunrealtype aw     = udata->aw;
  sunrealtype dx     = udata->dx;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype duconst, dvconst, dwconst, auconst, avconst, awconst, u, ul, ur,
    v, vl, vr, w, wl, wr;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  duconst = du / dx / dx;
  dvconst = dv / dx / dx;
  dwconst = dw / dx / dx;
  auconst = -au / SUN_RCONST(2.0) / dx;
  avconst = -av / SUN_RCONST(2.0) / dx;
  awconst = -aw / SUN_RCONST(2.0) / dx;
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    u  = Ydata[IDX(i, 0)];
    ul = Ydata[IDX(i - 1, 0)];
    ur = Ydata[IDX(i + 1, 0)];
    v  = Ydata[IDX(i, 1)];
    vl = Ydata[IDX(i - 1, 1)];
    vr = Ydata[IDX(i + 1, 1)];
    w  = Ydata[IDX(i, 2)];
    wl = Ydata[IDX(i - 1, 2)];
    wr = Ydata[IDX(i + 1, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = (ul - SUN_RCONST(2.0) * u + ur) * duconst +
                        (ur - ul) * auconst + a - (w + SUN_RCONST(1.0)) * u +
                        v * u * u;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = (vl - SUN_RCONST(2.0) * v + vr) * dvconst +
                        (vr - vl) * avconst + w * u - v * u * u;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (wl - SUN_RCONST(2.0) * w + wr) * dwconst +
                        (wr - wl) * awconst + (b - w) / ep - w * u;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}